

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void idtx8_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstride)

{
  undefined1 auVar1 [32];
  long lVar2;
  long lVar3;
  
  lVar2 = 0xe0;
  for (lVar3 = 0; lVar3 < col_num << 3; lVar3 = lVar3 + 8) {
    auVar1 = *(undefined1 (*) [32])((long)in[-7] + lVar2);
    auVar1 = vpaddd_avx2(auVar1,auVar1);
    *(undefined1 (*) [32])((long)out[-7] + lVar2) = auVar1;
    auVar1 = *(undefined1 (*) [32])((long)in[-6] + lVar2);
    auVar1 = vpaddd_avx2(auVar1,auVar1);
    *(undefined1 (*) [32])((long)out[-6] + lVar2) = auVar1;
    auVar1 = *(undefined1 (*) [32])((long)in[-5] + lVar2);
    auVar1 = vpaddd_avx2(auVar1,auVar1);
    *(undefined1 (*) [32])((long)out[-5] + lVar2) = auVar1;
    auVar1 = *(undefined1 (*) [32])((long)in[-4] + lVar2);
    auVar1 = vpaddd_avx2(auVar1,auVar1);
    *(undefined1 (*) [32])((long)out[-4] + lVar2) = auVar1;
    auVar1 = *(undefined1 (*) [32])((long)in[-3] + lVar2);
    auVar1 = vpaddd_avx2(auVar1,auVar1);
    *(undefined1 (*) [32])((long)out[-3] + lVar2) = auVar1;
    auVar1 = *(undefined1 (*) [32])((long)in[-2] + lVar2);
    auVar1 = vpaddd_avx2(auVar1,auVar1);
    *(undefined1 (*) [32])((long)out[-2] + lVar2) = auVar1;
    auVar1 = *(undefined1 (*) [32])((long)in[-1] + lVar2);
    auVar1 = vpaddd_avx2(auVar1,auVar1);
    *(undefined1 (*) [32])((long)out[-1] + lVar2) = auVar1;
    auVar1 = *(undefined1 (*) [32])((long)*in + lVar2);
    auVar1 = vpaddd_avx2(auVar1,auVar1);
    *(undefined1 (*) [32])((long)*out + lVar2) = auVar1;
    lVar2 = lVar2 + 0x100;
  }
  return;
}

Assistant:

static void idtx8_avx2(__m256i *in, __m256i *out, const int8_t bit, int col_num,
                       int outstride) {
  (void)bit;
  (void)outstride;
  int num_iters = 8 * col_num;
  for (int i = 0; i < num_iters; i += 8) {
    out[i] = _mm256_add_epi32(in[i], in[i]);
    out[i + 1] = _mm256_add_epi32(in[i + 1], in[i + 1]);
    out[i + 2] = _mm256_add_epi32(in[i + 2], in[i + 2]);
    out[i + 3] = _mm256_add_epi32(in[i + 3], in[i + 3]);
    out[i + 4] = _mm256_add_epi32(in[i + 4], in[i + 4]);
    out[i + 5] = _mm256_add_epi32(in[i + 5], in[i + 5]);
    out[i + 6] = _mm256_add_epi32(in[i + 6], in[i + 6]);
    out[i + 7] = _mm256_add_epi32(in[i + 7], in[i + 7]);
  }
}